

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O1

void __thiscall UnitTest1::CodeGenTest::MatchCodeGenTest1(CodeGenTest *this)

{
  size_t sVar1;
  char *pcVar2;
  _func_void_ptr_void_ptr *func;
  char str1 [43];
  MatchRoutineEM64T<char> match_routine;
  char *local_278;
  undefined1 local_270 [32];
  void *local_250;
  char local_248 [8];
  undefined3 uStack_240;
  undefined5 uStack_23d;
  undefined3 uStack_238;
  undefined5 uStack_235;
  undefined3 uStack_230;
  undefined5 uStack_22d;
  undefined3 uStack_228;
  char acStack_225 [21];
  MatchRoutineEM64T<char> local_210;
  
  uStack_228 = 0x616c20;
  builtin_strncpy(acStack_225,"zy dog.",8);
  builtin_strncpy(local_248,"A quick ",8);
  uStack_240 = 0x6f7262;
  uStack_23d = 0x6f66206e77;
  uStack_238 = 0x6a2078;
  uStack_235 = 0x2073706d75;
  uStack_230 = 0x65766f;
  uStack_22d = 0x6568742072;
  local_270._0_8_ = local_270 + 0x10;
  sVar1 = strlen(local_248);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,local_248,local_248 + sVar1);
  Centaurus::MatchRoutineEM64T<char>::MatchRoutineEM64T
            (&local_210,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
             (Logger *)0x0);
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_);
  }
  pcVar2 = (char *)malloc(0x30);
  *(ulong *)(pcVar2 + 0xb) = CONCAT35(uStack_238,uStack_23d);
  *(ulong *)(pcVar2 + 0x13) = CONCAT35(uStack_230,uStack_235);
  *(ulong *)(pcVar2 + 0x1b) = CONCAT35(uStack_228,uStack_22d);
  *(undefined8 *)(pcVar2 + 0x23) = acStack_225._0_8_;
  *(char (*) [8])pcVar2 = local_248;
  *(ulong *)(pcVar2 + 8) = CONCAT53(uStack_23d,uStack_240);
  *(ulong *)(pcVar2 + 0x10) = CONCAT53(uStack_235,uStack_238);
  *(ulong *)(pcVar2 + 0x18) = CONCAT53(uStack_22d,uStack_230);
  local_278 = pcVar2 + 0x2a;
  (*local_210.m_runtime.super_HostRuntime.super_Runtime._vptr_Runtime[2])
            (&local_210.m_runtime,local_270,&local_210.m_code);
  local_250 = (void *)(*(code *)local_270._0_8_)(pcVar2);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
            (&local_278,&local_250,(wchar_t *)0x0);
  local_210._vptr_MatchRoutineEM64T = (_func_int **)&PTR__MatchRoutineEM64T_001c9440;
  ::asmjit::CodeHolder::~CodeHolder(&local_210.m_code);
  ::asmjit::JitRuntime::~JitRuntime(&local_210.m_runtime);
  return;
}

Assistant:

TEST_METHOD(MatchCodeGenTest1)
    {
        using namespace Centaurus;

        const char str1[] = "A quick brown fox jumps over the lazy dog.";

        MatchRoutineEM64T<char> match_routine(str1);

        char *buf = (char *)malloc((sizeof(str1) + 15) / 16 * 16);
        memcpy(buf, str1, sizeof(str1));

        Assert::AreEqual((const void *)(buf + sizeof(str1) - 1), match_routine(buf));
    }